

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_points_3.h
# Opt level: O2

void draco::
     DequantizePoints3<__gnu_cxx::__normal_iterator<draco::VectorD<unsigned_int,3>*,std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::PointAttributeVectorOutputIterator<float>>
               (__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                *begin,__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                       *end,QuantizationInfo *info,PointAttributeVectorOutputIterator<float> *oit)

{
  float range;
  undefined8 uVar1;
  uint max_quantized_value;
  VectorD<unsigned_int,_3> *pVVar2;
  Dequantizer dequantize;
  VectorD<float,_3> local_38;
  
  range = info->range;
  max_quantized_value = ~(-1 << ((byte)info->quantization_bits & 0x1f));
  Dequantizer::Dequantizer(&dequantize);
  Dequantizer::Init(&dequantize,range,max_quantized_value);
  for (pVVar2 = begin->_M_current; pVVar2 != end->_M_current; pVVar2 = pVVar2 + 1) {
    local_38.v_._M_elems[2] =
         (float)(int)((pVVar2->v_)._M_elems[2] - max_quantized_value) * dequantize.delta_;
    uVar1 = *(undefined8 *)(pVVar2->v_)._M_elems;
    local_38.v_._M_elems[0] = dequantize.delta_ * (float)(int)((int)uVar1 - max_quantized_value);
    local_38.v_._M_elems[1] =
         dequantize.delta_ * (float)(int)((int)((ulong)uVar1 >> 0x20) - max_quantized_value);
    PointAttributeVectorOutputIterator<float>::operator=(oit,&local_38);
    (oit->point_id_).value_ = (oit->point_id_).value_ + 1;
  }
  return;
}

Assistant:

void DequantizePoints3(const QPointIterator &begin, const QPointIterator &end,
                       const QuantizationInfo &info, OutputIterator &oit) {
  DRACO_DCHECK_GE(info.quantization_bits, 0);
  DRACO_DCHECK_GE(info.range, 0);

  const uint32_t quantization_bits = info.quantization_bits;
  const float range = info.range;
  const uint32_t max_quantized_value((1u << quantization_bits) - 1);
  Dequantizer dequantize;
  dequantize.Init(range, max_quantized_value);

  for (auto it = begin; it != end; ++it) {
    const float x = dequantize((*it)[0] - max_quantized_value);
    const float y = dequantize((*it)[1] - max_quantized_value);
    const float z = dequantize((*it)[2] - max_quantized_value);
    *oit = Point3f(x, y, z);
    ++oit;
  }
}